

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Federate.cpp
# Opt level: O0

string * __thiscall
helics::Federate::query_abi_cxx11_(Federate *this,string_view queryStr,HelicsSequencingModes mode)

{
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_00;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_01;
  basic_string_view<char,_std::char_traits<char>_> __x;
  basic_string_view<char,_std::char_traits<char>_> __x_00;
  basic_string_view<char,_std::char_traits<char>_> __x_01;
  bool bVar1;
  element_type *peVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  string *psVar3;
  undefined8 in_RCX;
  undefined8 in_RDX;
  Federate *in_RSI;
  string *in_RDI;
  undefined4 in_R8D;
  __sv_type _Var4;
  string *res;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe60;
  char *in_stack_fffffffffffffe68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe70;
  size_t in_stack_fffffffffffffe78;
  string *string;
  undefined1 in_stack_fffffffffffffea8 [16];
  undefined1 local_148 [32];
  undefined4 local_128;
  undefined4 uStack_124;
  undefined4 uStack_120;
  undefined4 uStack_11c;
  undefined1 local_118 [80];
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_88;
  undefined8 local_80;
  undefined8 local_38;
  undefined8 local_30;
  undefined1 local_25;
  undefined4 local_24;
  undefined8 local_18;
  undefined8 uStack_10;
  
  local_25 = 0;
  string = in_RDI;
  local_24 = in_R8D;
  local_18 = in_RDX;
  uStack_10 = in_RCX;
  std::__cxx11::string::string(in_stack_fffffffffffffe70);
  local_38 = local_18;
  local_30 = uStack_10;
  CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffe70,
             in_stack_fffffffffffffe68);
  __x._M_str = (char *)in_RSI;
  __x._M_len = (size_t)string;
  __y._M_str = (char *)in_RDI;
  __y._M_len = in_stack_fffffffffffffe78;
  bVar1 = std::operator==(__x,__y);
  if (bVar1) {
    getName_abi_cxx11_(in_RSI);
    generateJsonQuotedString((string *)string);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (in_stack_fffffffffffffea8._8_8_,in_stack_fffffffffffffea8._0_8_);
    std::__cxx11::string::~string(in_stack_fffffffffffffe60);
  }
  else {
    local_88 = local_18;
    local_80 = uStack_10;
    CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffe70,
               in_stack_fffffffffffffe68);
    __x_00._M_str = (char *)in_RSI;
    __x_00._M_len = (size_t)string;
    __y_00._M_str = (char *)in_RDI;
    __y_00._M_len = in_stack_fffffffffffffe78;
    bVar1 = std::operator==(__x_00,__y_00);
    if (bVar1) {
      peVar2 = std::__shared_ptr_access<helics::Core,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<helics::Core,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x31f7ae);
      (*peVar2->_vptr_Core[0xc])();
      generateJsonQuotedString((string *)string);
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      operator=(in_stack_fffffffffffffea8._8_8_,in_stack_fffffffffffffea8._0_8_);
      std::__cxx11::string::~string(in_stack_fffffffffffffe60);
    }
    else {
      local_c8 = local_18;
      local_c0 = uStack_10;
      CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffe70,
                 in_stack_fffffffffffffe68);
      __x_01._M_str = (char *)in_RSI;
      __x_01._M_len = (size_t)string;
      __y_01._M_str = (char *)in_RDI;
      __y_01._M_len = in_stack_fffffffffffffe78;
      bVar1 = std::operator==(__x_01,__y_01);
      if (bVar1) {
        TimeRepresentation::operator_cast_to_double
                  ((TimeRepresentation<count_time<9,_long>_> *)0x31f866);
        CLI::std::__cxx11::to_string((double)in_stack_fffffffffffffe68);
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        operator=(in_stack_fffffffffffffea8._8_8_,in_stack_fffffffffffffea8._0_8_);
        std::__cxx11::string::~string(in_stack_fffffffffffffe60);
      }
      else {
        local_128 = (undefined4)local_18;
        uStack_124 = local_18._4_4_;
        uStack_120 = (undefined4)uStack_10;
        uStack_11c = uStack_10._4_4_;
        (*in_RSI->_vptr_Federate[0xe])(local_118,in_RSI,local_18,uStack_10);
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        operator=(in_stack_fffffffffffffea8._8_8_,in_stack_fffffffffffffea8._0_8_);
        std::__cxx11::string::~string(in_stack_fffffffffffffe60);
      }
    }
  }
  bVar1 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x31f8fb);
  if (bVar1) {
    this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              std::__shared_ptr_access<helics::Core,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<helics::Core,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x31f912);
    psVar3 = getName_abi_cxx11_(in_RSI);
    _Var4 = std::__cxx11::string::operator_cast_to_basic_string_view(this_00);
    (**(code **)((this_00->_M_dataplus)._M_p + 0x2f0))
              (local_148,this_00,_Var4._M_len,_Var4._M_str,local_18,uStack_10,local_24,this_00,
               psVar3);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Var4._M_str,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Var4._M_len);
    std::__cxx11::string::~string(this_00);
  }
  return string;
}

Assistant:

std::string Federate::query(std::string_view queryStr, HelicsSequencingModes mode)
{
    std::string res;
    if (queryStr == "name") {
        res = generateJsonQuotedString(getName());
    } else if (queryStr == "corename") {
        res = generateJsonQuotedString(coreObject->getIdentifier());
    } else if (queryStr == "time") {
        res = std::to_string(mCurrentTime);
    } else {
        res = localQuery(queryStr);
    }
    if (res.empty()) {
        res = coreObject->query(getName(), queryStr, mode);
    }
    return res;
}